

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

string * __thiscall
libcellml::Printer::PrinterImpl::printResetChild
          (string *__return_storage_ptr__,PrinterImpl *this,string *childLabel,string *childId,
          string *math,IdList *idList,bool autoIds)

{
  ulong uVar1;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_3a;
  byte local_39;
  IdList *pIStack_38;
  bool autoIds_local;
  IdList *idList_local;
  string *math_local;
  string *childId_local;
  string *childLabel_local;
  PrinterImpl *this_local;
  string *repr;
  
  local_39 = autoIds;
  local_3a = 0;
  pIStack_38 = idList;
  idList_local = (IdList *)math;
  math_local = childId;
  childId_local = childLabel;
  childLabel_local = (string *)this;
  this_local = (PrinterImpl *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) || (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    std::operator+(&local_60,"<",childId_local);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator+(&local_b0," id=\"",math_local);
      std::operator+(&local_90,&local_b0,"\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else if ((local_39 & 1) != 0) {
      makeUniqueId(&local_110,pIStack_38);
      std::operator+(&local_f0," id=\"",&local_110);
      std::operator+(&local_d0,&local_f0,"\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
    }
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      printMath(&local_1b0,this,(string *)idList_local);
      std::operator+(&local_190,">",&local_1b0);
      std::operator+(&local_170,&local_190,"</");
      std::operator+(&local_150,&local_170,childId_local);
      std::operator+(&local_130,&local_150,">");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/>");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Printer::PrinterImpl::printResetChild(const std::string &childLabel, const std::string &childId,
                                                  const std::string &math, IdList &idList, bool autoIds)
{
    std::string repr;

    if (!childId.empty() || !math.empty()) {
        repr += "<" + childLabel;
        if (!childId.empty()) {
            repr += " id=\"" + childId + "\"";
        } else if (autoIds) {
            repr += " id=\"" + makeUniqueId(idList) + "\"";
        }
        if (math.empty()) {
            repr += "/>";
        } else {
            repr += ">" + printMath(math) + "</" + childLabel + ">";
        }
    }

    return repr;
}